

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

uint16_t eia608_midrow_change(int chan,eia608_style_t style,int underline)

{
  uint16_t uVar1;
  
  uVar1 = eia608_parity(0);
  return uVar1;
}

Assistant:

uint16_t eia608_midrow_change(int chan, eia608_style_t style, int underline) { return eia608_parity(0x1120 | ((chan << 11) & 0x0800) | ((style << 1) & 0x000E) | (underline & 0x0001)); }